

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

void __thiscall ConstantAccel::Print(ConstantAccel *this,ostream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ConstantAccel: a = ",0x13);
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).accel);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", pf = ",7);
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).pf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", vf = ",7);
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).vf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", tf = ",7);
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).tf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "ConstantAccel: a = " << accel << ", pf = " << pf << ", vf = " << vf << ", tf = " << tf << std::endl; }